

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cc
# Opt level: O2

Packet * __thiscall
iqxmlrpc::Https_proxy_client_connection::do_process_session
          (Https_proxy_client_connection *this,string *s)

{
  Packet *pPVar1;
  Https_client_connection https_conn;
  Https_client_connection HStack_148;
  
  setup_tunnel(this);
  Https_client_connection::Https_client_connection
            (&HStack_148,&(this->super_Connection).sock,this->non_blocking);
  Https_client_connection::post_connect(&HStack_148);
  pPVar1 = Https_client_connection::do_process_session(&HStack_148,s);
  Https_client_connection::~Https_client_connection(&HStack_148);
  return pPVar1;
}

Assistant:

http::Packet* Https_proxy_client_connection::do_process_session( const std::string& s )
{
  setup_tunnel();

  Https_client_connection https_conn(sock, non_blocking);
  https_conn.post_connect();

  return https_conn.do_process_session(s);
}